

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBlending.cpp
# Opt level: O0

IterateResult __thiscall
glcts::DrawBuffersIndexedBlending::iterate(DrawBuffersIndexedBlending *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  code *pcVar6;
  Context *context;
  code *pcVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  deUint32 dVar12;
  undefined4 uVar13;
  RGBA epsilon_00;
  RenderContext *pRVar14;
  undefined4 extraout_var;
  float *pfVar15;
  TestLog *pTVar16;
  char *pcVar17;
  ostream *this_00;
  MessageBuilder *pMVar18;
  float local_8fc;
  float local_8f0;
  float local_8e4;
  float local_8c0;
  float local_8b8;
  float local_8b4;
  float local_8a8;
  float local_89c;
  float local_898;
  float local_88c;
  float local_880;
  float local_874;
  float local_864;
  float local_85c;
  float local_854;
  float local_83c;
  float local_834;
  float local_82c;
  GLenum error_code;
  allocator<char> local_7d1;
  string local_7d0;
  allocator<char> local_7a9;
  string local_7a8;
  LogImage local_788;
  MessageBuilder local_6f8;
  deUint32 local_578;
  deUint32 local_574;
  PixelBufferAccess local_570;
  TextureFormat local_548;
  undefined1 local_540 [8];
  TextureLevel textureLevel;
  int i_4;
  RGBA epsilon;
  bool success;
  undefined1 local_4e8 [8];
  ostringstream os;
  undefined1 local_368 [4];
  int i_3;
  Vec3 vertices [6];
  GLuint positionLocation;
  string local_310;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  string local_2a8;
  ProgramSources local_288;
  undefined1 local_1b8 [8];
  ShaderProgram program;
  int local_d4;
  undefined1 local_d0 [4];
  int i_2;
  BlendMaskStateMachine state;
  RGBA expected [4];
  undefined1 local_88 [4];
  int numComponents;
  Vec4 colors [4];
  undefined1 local_40 [4];
  int i_1;
  Vec4 background;
  int i;
  GLuint tex;
  GLint maxDrawBuffers;
  GLenum format;
  Functions *gl;
  DrawBuffersIndexedBlending *this_local;
  
  gl = (Functions *)this;
  pRVar14 = deqp::Context::getRenderContext
                      ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context);
  iVar10 = (*pRVar14->_vptr_RenderContext[3])();
  _maxDrawBuffers = CONCAT44(extraout_var,iVar10);
  tex = iterate::BlendFormats[iterate::formatId];
  prepareFramebuffer(this);
  i = 0;
  (**(code **)(_maxDrawBuffers + 0x868))(0x8824,&i);
  if (i < 4) {
    tcu::TestContext::setTestResult
              ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.super_TestNode
               .m_testCtx,QP_TEST_RESULT_FAIL,"Minimum number of draw buffers too low");
    this_local._4_4_ = STOP;
  }
  else {
    (**(code **)(_maxDrawBuffers + 0x6f8))(1,background.m_data + 3);
    (**(code **)(_maxDrawBuffers + 0xb8))(0x8c1a,background.m_data[3]);
    (**(code **)(_maxDrawBuffers + 0x1398))(0x8c1a,1,tex,0x20);
    for (background.m_data[2] = 0.0; (int)background.m_data[2] < i;
        background.m_data[2] = (float)((int)background.m_data[2] + 1)) {
      (**(code **)(_maxDrawBuffers + 0x6b8))
                (0x8d40,(int)background.m_data[2] + 0x8ce0,background.m_data[3],0,
                 background.m_data[2]);
    }
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_40,0.5,0.5,0.5,0.5);
    for (colors[3].m_data[3] = 0.0; fVar1 = colors[3].m_data[3], (int)colors[3].m_data[3] < i;
        colors[3].m_data[3] = (float)((int)colors[3].m_data[3] + 1)) {
      pcVar6 = *(code **)(_maxDrawBuffers + 0x1a8);
      pfVar15 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_40,0);
      (*pcVar6)(0x1800,fVar1,pfVar15);
    }
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_88,0.86,0.22,0.31,0.45);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[0].m_data + 2),0.12,0.83,0.34,0.42);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[1].m_data + 2),0.56,0.63,0.76,0.99);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[2].m_data + 2),0.14,0.34,0.34,0.22);
    uVar11 = NumComponents(this,tex);
    pfVar15 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_40);
    fVar1 = *pfVar15;
    if ((int)uVar11 < 2) {
      local_82c = 0.0;
    }
    else {
      pfVar15 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_88);
      local_82c = *pfVar15;
    }
    if ((int)uVar11 < 3) {
      local_834 = 0.0;
    }
    else {
      pfVar15 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_88);
      local_834 = *pfVar15;
    }
    if (uVar11 == 4) {
      pfVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_40);
      local_83c = *pfVar15;
    }
    else {
      local_83c = 1.0;
    }
    tcu::RGBA::RGBA((RGBA *)&state.testLog,(int)(long)(fVar1 * 255.0),(int)(long)(local_82c * 255.0)
                    ,(int)(long)(local_834 * 255.0),(int)(long)(local_83c * 255.0));
    pfVar15 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_40);
    fVar1 = *pfVar15;
    if ((int)uVar11 < 2) {
      local_854 = 0.0;
    }
    else {
      pfVar15 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_40);
      local_854 = *pfVar15;
    }
    if ((int)uVar11 < 3) {
      local_85c = 0.0;
    }
    else {
      pfVar15 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_40);
      local_85c = *pfVar15;
    }
    if (uVar11 == 4) {
      pfVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(colors[0].m_data + 2));
      local_864 = *pfVar15;
    }
    else {
      local_864 = 1.0;
    }
    tcu::RGBA::RGBA((RGBA *)((long)&state.testLog + 4),(int)(long)(fVar1 * 255.0),
                    (int)(long)(local_854 * 255.0),(int)(long)(local_85c * 255.0),
                    (int)(long)(local_864 * 255.0));
    pfVar15 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(colors[1].m_data + 2));
    fVar1 = *pfVar15;
    if (uVar11 == 4) {
      pfVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(colors[1].m_data + 2));
      local_874 = *pfVar15;
    }
    else {
      local_874 = 1.0;
    }
    pfVar15 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_40);
    fVar2 = *pfVar15;
    if (uVar11 == 4) {
      pfVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_40);
      local_880 = *pfVar15;
    }
    else {
      local_880 = 1.0;
    }
    if ((int)uVar11 < 2) {
      local_89c = 0.0;
    }
    else {
      pfVar15 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(colors[1].m_data + 2));
      fVar3 = *pfVar15;
      if (uVar11 == 4) {
        pfVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(colors[1].m_data + 2));
        local_88c = *pfVar15;
      }
      else {
        local_88c = 1.0;
      }
      pfVar15 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_40);
      fVar4 = *pfVar15;
      if (uVar11 == 4) {
        pfVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_40);
        local_898 = *pfVar15;
      }
      else {
        local_898 = 1.0;
      }
      local_89c = fVar3 * local_88c + -(fVar4 * local_898);
    }
    if ((int)uVar11 < 3) {
      local_8b8 = 0.0;
    }
    else {
      pfVar15 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(colors[1].m_data + 2));
      fVar3 = *pfVar15;
      if (uVar11 == 4) {
        pfVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(colors[1].m_data + 2));
        local_8a8 = *pfVar15;
      }
      else {
        local_8a8 = 1.0;
      }
      pfVar15 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_40);
      fVar4 = *pfVar15;
      if (uVar11 == 4) {
        pfVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_40);
        local_8b4 = *pfVar15;
      }
      else {
        local_8b4 = 1.0;
      }
      local_8b8 = fVar3 * local_8a8 + -(fVar4 * local_8b4);
    }
    if (uVar11 == 4) {
      pfVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(colors[1].m_data + 2));
      fVar3 = *pfVar15;
      pfVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(colors[1].m_data + 2));
      fVar4 = *pfVar15;
      pfVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_40);
      fVar5 = *pfVar15;
      pfVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_40);
      local_8c0 = fVar3 * fVar4 + -(fVar5 * *pfVar15);
    }
    else {
      local_8c0 = 1.0;
    }
    tcu::RGBA::RGBA(expected,(int)(long)((fVar1 * local_874 - fVar2 * local_880) * 255.0),
                    (int)(long)(local_89c * 255.0),(int)(long)(local_8b8 * 255.0),
                    (int)(long)(local_8c0 * 255.0));
    pfVar15 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_40);
    fVar1 = *pfVar15;
    pfVar15 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(colors[2].m_data + 2));
    fVar2 = *pfVar15;
    if ((int)uVar11 < 2) {
      local_8e4 = 0.0;
    }
    else {
      pfVar15 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_40);
      local_8e4 = *pfVar15;
      pfVar15 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(colors[2].m_data + 2));
      local_8e4 = local_8e4 - *pfVar15;
    }
    if ((int)uVar11 < 3) {
      local_8f0 = 0.0;
    }
    else {
      pfVar15 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_40);
      local_8f0 = *pfVar15;
      pfVar15 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(colors[2].m_data + 2));
      local_8f0 = local_8f0 - *pfVar15;
    }
    if (uVar11 == 4) {
      pfVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_40);
      local_8fc = *pfVar15;
      pfVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(colors[2].m_data + 2));
      local_8fc = local_8fc - *pfVar15;
    }
    else {
      local_8fc = 1.0;
    }
    tcu::RGBA::RGBA(expected + 1,(int)(long)((fVar1 - fVar2) * 255.0),(int)(long)(local_8e4 * 255.0)
                    ,(int)(long)(local_8f0 * 255.0),(int)(long)(local_8fc * 255.0));
    context = (this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context;
    pTVar16 = tcu::TestContext::getLog
                        ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                         super_TestNode.m_testCtx);
    DrawBuffersIndexedBase::BlendMaskStateMachine::BlendMaskStateMachine
              ((BlendMaskStateMachine *)local_d0,context,pTVar16,i);
    for (local_d4 = 0; local_d4 < i; local_d4 = local_d4 + 1) {
      switch(local_d4 % 4) {
      case 0:
        DrawBuffersIndexedBase::BlendMaskStateMachine::SetEnablei
                  ((BlendMaskStateMachine *)local_d0,local_d4);
        DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquationSeparatei
                  ((BlendMaskStateMachine *)local_d0,local_d4,0x8007,0x8008);
        DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFunci
                  ((BlendMaskStateMachine *)local_d0,local_d4,1,1);
        break;
      case 1:
        DrawBuffersIndexedBase::BlendMaskStateMachine::SetEnablei
                  ((BlendMaskStateMachine *)local_d0,local_d4);
        DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquationi
                  ((BlendMaskStateMachine *)local_d0,local_d4,0x8006);
        DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFuncSeparatei
                  ((BlendMaskStateMachine *)local_d0,local_d4,0,1,1,0);
        break;
      case 2:
        DrawBuffersIndexedBase::BlendMaskStateMachine::SetEnablei
                  ((BlendMaskStateMachine *)local_d0,local_d4);
        DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquationi
                  ((BlendMaskStateMachine *)local_d0,local_d4,0x800a);
        DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFunci
                  ((BlendMaskStateMachine *)local_d0,local_d4,0x302,0x304);
        break;
      case 3:
        DrawBuffersIndexedBase::BlendMaskStateMachine::SetEnablei
                  ((BlendMaskStateMachine *)local_d0,local_d4);
        DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquationi
                  ((BlendMaskStateMachine *)local_d0,local_d4,0x800b);
        DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFunci
                  ((BlendMaskStateMachine *)local_d0,local_d4,1,1);
      }
    }
    pRVar14 = deqp::Context::getRenderContext
                        ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context);
    GenVS_abi_cxx11_(&local_2c8,this);
    pcVar17 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,pcVar17,&local_2c9);
    GenFS_abi_cxx11_(&local_310,this,i);
    pcVar17 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,pcVar17,(allocator<char> *)((long)&positionLocation + 3));
    glu::makeVtxFragSources(&local_288,&local_2a8,&local_2f0);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1b8,pRVar14,&local_288);
    glu::ProgramSources::~ProgramSources(&local_288);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&positionLocation + 3));
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2c9);
    std::__cxx11::string::~string((string *)&local_2c8);
    bVar8 = glu::ShaderProgram::isOk((ShaderProgram *)local_1b8);
    if (bVar8) {
      pcVar6 = *(code **)(_maxDrawBuffers + 0x1680);
      dVar12 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1b8);
      (*pcVar6)(dVar12);
      pcVar6 = *(code **)(_maxDrawBuffers + 0x780);
      dVar12 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1b8);
      vertices[5].m_data[2] = (float)(*pcVar6)(dVar12,"position");
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_368,-1.0,-1.0,0.0);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(vertices[0].m_data + 1),1.0,-1.0,0.0);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(vertices[1].m_data + 1),-1.0,1.0,0.0);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(vertices[2].m_data + 1),1.0,1.0,0.0);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(vertices[3].m_data + 1),-1.0,1.0,0.0);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(vertices[4].m_data + 1),1.0,-1.0,0.0);
      (**(code **)(_maxDrawBuffers + 0x19f0))(vertices[5].m_data[2],3,0x1406,0,0,local_368);
      (**(code **)(_maxDrawBuffers + 0x610))(vertices[5].m_data[2]);
      for (os._372_4_ = 0; (int)os._372_4_ < i; os._372_4_ = os._372_4_ + 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e8);
        this_00 = std::operator<<((ostream *)local_4e8,"c");
        std::ostream::operator<<(this_00,os._372_4_);
        pcVar6 = *(code **)(_maxDrawBuffers + 0x15a8);
        pcVar7 = *(code **)(_maxDrawBuffers + 0xb48);
        dVar12 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1b8);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::c_str();
        uVar13 = (*pcVar7)(dVar12);
        pfVar15 = tcu::Vector<float,_4>::operator[]
                            ((Vector<float,_4> *)(local_88 + (long)((int)os._372_4_ % 4) * 0x10),0);
        (*pcVar6)(uVar13,1,pfVar15);
        std::__cxx11::string::~string((string *)&epsilon);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e8);
      }
      (**(code **)(_maxDrawBuffers + 0x538))(4,0,6);
      bVar8 = true;
      epsilon_00 = GetEpsilon(this);
      for (textureLevel.m_data.m_cap._4_4_ = 0; textureLevel.m_data.m_cap._4_4_ < i;
          textureLevel.m_data.m_cap._4_4_ = textureLevel.m_data.m_cap._4_4_ + 1) {
        (**(code **)(_maxDrawBuffers + 0x1218))(textureLevel.m_data.m_cap._4_4_ + 0x8ce0);
        tcu::TextureFormat::TextureFormat(&local_548,RGBA,UNORM_INT8);
        tcu::TextureLevel::TextureLevel((TextureLevel *)local_540,&local_548,0x20,0x20,1);
        pRVar14 = deqp::Context::getRenderContext
                            ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context);
        tcu::TextureLevel::getAccess(&local_570,(TextureLevel *)local_540);
        glu::readPixels(pRVar14,0,0,&local_570);
        local_574 = expected[(long)(textureLevel.m_data.m_cap._4_4_ % 4) + -2].m_value;
        local_578 = epsilon_00.m_value;
        bVar9 = VerifyImg(this,(TextureLevel *)local_540,(RGBA)local_574,epsilon_00);
        if (!bVar9) {
          pTVar16 = tcu::TestContext::getLog
                              ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.
                               super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_6f8,pTVar16,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar18 = tcu::MessageBuilder::operator<<
                              (&local_6f8,(char (*) [34])"Blending error in texture format ");
          pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,&tex);
          pMVar18 = tcu::MessageBuilder::operator<<
                              (pMVar18,(char (*) [28])" occurred for draw buffer #");
          pMVar18 = tcu::MessageBuilder::operator<<
                              (pMVar18,(int *)((long)&textureLevel.m_data.m_cap + 4));
          pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [2])0x2b8f97b);
          tcu::MessageBuilder::operator<<(pMVar18,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_6f8);
          pTVar16 = tcu::TestContext::getLog
                              ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.
                               super_TestCase.super_TestNode.m_testCtx);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7a8,"Result",&local_7a9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7d0,"Rendered result image",&local_7d1);
          tcu::TextureLevel::getAccess
                    ((PixelBufferAccess *)&stack0xfffffffffffff800,(TextureLevel *)local_540);
          tcu::LogImage::LogImage
                    (&local_788,&local_7a8,&local_7d0,
                     (ConstPixelBufferAccess *)&stack0xfffffffffffff800,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::TestLog::operator<<(pTVar16,&local_788);
          tcu::LogImage::~LogImage(&local_788);
          std::__cxx11::string::~string((string *)&local_7d0);
          std::allocator<char>::~allocator(&local_7d1);
          std::__cxx11::string::~string((string *)&local_7a8);
          std::allocator<char>::~allocator(&local_7a9);
          bVar8 = false;
        }
        tcu::TextureLevel::~TextureLevel((TextureLevel *)local_540);
      }
      (**(code **)(_maxDrawBuffers + 0x4e8))(0xbe2);
      (**(code **)(_maxDrawBuffers + 0x1680))(0);
      (**(code **)(_maxDrawBuffers + 0xb8))(0x8c1a,0);
      (**(code **)(_maxDrawBuffers + 0x480))(1);
      releaseFramebuffer(this);
      iVar10 = (**(code **)(_maxDrawBuffers + 0x800))();
      if (iVar10 == 0) {
        if (bVar8) {
          iterate::formatId = iterate::formatId + 1;
          if (iterate::formatId < 6) {
            this_local._4_4_ = CONTINUE;
          }
          else {
            tcu::TestContext::setTestResult
                      ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                       super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
            iterate::formatId = 0;
            this_local._4_4_ = STOP;
          }
        }
        else {
          tcu::TestContext::setTestResult
                    ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                     super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Blending error occurred");
          iterate::formatId = 0;
          this_local._4_4_ = STOP;
        }
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                   super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Some functions generated error");
        iterate::formatId = 0;
        this_local._4_4_ = STOP;
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Could not create shader program");
      this_local._4_4_ = STOP;
    }
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1b8);
    DrawBuffersIndexedBase::BlendMaskStateMachine::~BlendMaskStateMachine
              ((BlendMaskStateMachine *)local_d0);
  }
  return this_local._4_4_;
}

Assistant:

tcu::TestNode::IterateResult DrawBuffersIndexedBlending::iterate()
{
	static const glw::GLenum BlendFormats[] = {
		GL_R8, GL_RG8, GL_RGB8, GL_RGB565, GL_RGBA4, GL_RGBA8,
	};
	static const int	kSize	= 32;
	static unsigned int formatId = 0;

	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	glw::GLenum			  format = BlendFormats[formatId];

	prepareFramebuffer();

	// Check number of available draw buffers
	glw::GLint maxDrawBuffers = 0;
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	if (maxDrawBuffers < 4)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Minimum number of draw buffers too low");
		return STOP;
	}

	// Prepare render targets
	glw::GLuint tex;
	gl.genTextures(1, &tex);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, tex);
	gl.texStorage3D(GL_TEXTURE_2D_ARRAY, 1, format, kSize, kSize, maxDrawBuffers);
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		gl.framebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, tex, 0, i);
	}

	// Clear background color
	tcu::Vec4 background(0.5f, 0.5f, 0.5f, 0.5f);
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		gl.clearBufferfv(GL_COLOR, i, &background[0]);
	}

	// Prepare expected, blended color values
	tcu::Vec4 colors[] = { tcu::Vec4(0.86f, 0.22f, 0.31f, 0.45f), tcu::Vec4(0.12f, 0.83f, 0.34f, 0.42f),
						   tcu::Vec4(0.56f, 0.63f, 0.76f, 0.99f), tcu::Vec4(0.14f, 0.34f, 0.34f, 0.22f) };

	int		  numComponents = NumComponents(format);
	tcu::RGBA expected[]	= {
		// GL_MIN
		tcu::RGBA(static_cast<unsigned int>(background.x() * 255),
				  static_cast<unsigned int>((numComponents >= 2 ? colors[0].y() : 0.0f) * 255),
				  static_cast<unsigned int>((numComponents >= 3 ? colors[0].z() : 0.0f) * 255),
				  static_cast<unsigned int>((numComponents == 4 ? background.w() : 1.0f) * 255)),
		// GL_FUNC_ADD
		tcu::RGBA(static_cast<unsigned int>(background.x() * 255),
				  static_cast<unsigned int>((numComponents >= 2 ? background.y() : 0.0f) * 255),
				  static_cast<unsigned int>((numComponents >= 3 ? background.z() : 0.0f) * 255),
				  static_cast<unsigned int>((numComponents == 4 ? colors[1].w() : 1.0f) * 255)),
		// GL_FUNC_SUBTRACT
		tcu::RGBA(
			static_cast<unsigned int>((colors[2].x() * (numComponents == 4 ? colors[2].w() : 1.0f) -
									   background.x() * (numComponents == 4 ? background.w() : 1.0f)) *
									  255),
			static_cast<unsigned int>((numComponents >= 2 ?
										   (colors[2].y() * (numComponents == 4 ? colors[2].w() : 1.0f) -
											background.y() * (numComponents == 4 ? background.w() : 1.0f)) :
										   0.0f) *
									  255),
			static_cast<unsigned int>((numComponents >= 3 ?
										   (colors[2].z() * (numComponents == 4 ? colors[2].w() : 1.0f) -
											background.z() * (numComponents == 4 ? background.w() : 1.0f)) :
										   0.0f) *
									  255),
			static_cast<unsigned int>(
				(numComponents == 4 ? (colors[2].w() * colors[2].w() - background.w() * background.w()) : 1.0f) * 255)),
		// GL_FUNC_REVERSE_SUBTRACT
		tcu::RGBA(static_cast<unsigned int>((background.x() - colors[3].x()) * 255),
				  static_cast<unsigned int>((numComponents >= 2 ? (background.y() - colors[3].y()) : 0.0f) * 255),
				  static_cast<unsigned int>((numComponents >= 3 ? (background.z() - colors[3].z()) : 0.0f) * 255),
				  static_cast<unsigned int>((numComponents == 4 ? (background.w() - colors[3].w()) : 1.0f) * 255))
	};

	// Setup blending operations
	BlendMaskStateMachine state(m_context, m_testCtx.getLog(), maxDrawBuffers);
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		switch (i % 4)
		{
		case 0:
			// GL_MIN
			state.SetEnablei(i);
			state.SetBlendEquationSeparatei(i, GL_MIN, GL_MAX);
			state.SetBlendFunci(i, GL_ONE, GL_ONE);
			break;
		case 1:
			// GL_FUNC_ADD
			state.SetEnablei(i);
			state.SetBlendEquationi(i, GL_FUNC_ADD);
			state.SetBlendFuncSeparatei(i, GL_ZERO, GL_ONE, GL_ONE, GL_ZERO);
			break;
		case 2:
			// GL_FUNC_SUBTRACT
			state.SetEnablei(i);
			state.SetBlendEquationi(i, GL_FUNC_SUBTRACT);
			state.SetBlendFunci(i, GL_SRC_ALPHA, GL_DST_ALPHA);
			break;
		case 3:
			// GL_FUNC_REVERSE_SUBTRACT
			state.SetEnablei(i);
			state.SetBlendEquationi(i, GL_FUNC_REVERSE_SUBTRACT);
			state.SetBlendFunci(i, GL_ONE, GL_ONE);
			break;
		}
	}

	// Prepare shader programs and draw fullscreen quad
	glu::ShaderProgram program(m_context.getRenderContext(),
							   glu::makeVtxFragSources(GenVS().c_str(), GenFS(maxDrawBuffers).c_str()));
	if (!program.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Could not create shader program");
		return STOP;
	}
	gl.useProgram(program.getProgram());

	glw::GLuint positionLocation = gl.getAttribLocation(program.getProgram(), "position");
	tcu::Vec3   vertices[]		 = {
		tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, -1.0f, 0.0f), tcu::Vec3(-1.0f, 1.0f, 0.0f),
		tcu::Vec3(1.0f, 1.0f, 0.0f),   tcu::Vec3(-1.0f, 1.0f, 0.0f), tcu::Vec3(1.0f, -1.0f, 0.0f)
	};

	gl.vertexAttribPointer(positionLocation, 3, GL_FLOAT, GL_FALSE, 0, vertices);
	gl.enableVertexAttribArray(positionLocation);

	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		std::ostringstream os;
		os << "c" << i;
		// i.e.: glUniform4fv(glGetUniformLocation(m_program, "c0"), 1, &colors[i].r);
		gl.uniform4fv(gl.getUniformLocation(program.getProgram(), os.str().c_str()), 1, &colors[i % 4][0]);
	}

	gl.drawArrays(GL_TRIANGLES, 0, 6);

	// Read buffer colors and validate proper blending behaviour
	bool	  success = true;
	tcu::RGBA epsilon = GetEpsilon();
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		gl.readBuffer(GL_COLOR_ATTACHMENT0 + i);

		tcu::TextureLevel textureLevel(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8),
									   kSize, kSize);
		glu::readPixels(m_context.getRenderContext(), 0, 0, textureLevel.getAccess());

		if (!VerifyImg(textureLevel, expected[i % 4], epsilon))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Blending error in texture format " << format
							   << " occurred for draw buffer #" << i << "\n"
							   << tcu::TestLog::EndMessage;
			m_testCtx.getLog() << tcu::TestLog::Image("Result", "Rendered result image", textureLevel.getAccess());
			success = false;
		}
	}

	gl.disable(GL_BLEND);
	gl.useProgram(0);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, 0);
	gl.deleteTextures(1, &tex);
	releaseFramebuffer();

	// Check for error
	glw::GLenum error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Some functions generated error");
		formatId = 0;
		return STOP;
	}

	if (!success)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Blending error occurred");
		formatId = 0;
		return STOP;
	}
	else
	{
		++formatId;
		if (formatId < (sizeof(BlendFormats) / sizeof(BlendFormats[0])))
		{
			return CONTINUE;
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
			formatId = 0;
			return STOP;
		}
	}
}